

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtt.c
# Opt level: O2

void parse_timestamps(utf8_char_t *line,double *start_pts,double *end_pts,char **cue_settings)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  char *__dest;
  double dVar4;
  char end_str [32];
  char start_str [32];
  char cue_str [1024];
  utf8_char_t auStack_468 [32];
  utf8_char_t local_448 [32];
  char local_428 [1032];
  
  uVar1 = __isoc99_sscanf(line," %31s --> %31s%1023[^\n\r]",local_448,auStack_468,local_428);
  *start_pts = -1.0;
  *cue_settings = (char *)0x0;
  printf("Matches: %d\n",(ulong)uVar1);
  if (0 < (int)uVar1) {
    dVar4 = parse_timestamp(local_448);
    *start_pts = dVar4;
    printf("Start pts: %f\n");
    if (uVar1 != 1) {
      dVar4 = parse_timestamp(auStack_468);
      *end_pts = dVar4;
      if (uVar1 == 3) {
        sVar3 = strlen(local_428);
        if (sVar3 != 0) {
          iVar2 = (int)sVar3;
          __dest = (char *)malloc((long)(iVar2 + 1));
          *cue_settings = __dest;
          strncpy(__dest,local_428,(long)iVar2);
          __dest[iVar2] = '\0';
        }
      }
    }
  }
  return;
}

Assistant:

void parse_timestamps(const utf8_char_t* line, double* start_pts, double* end_pts, char** cue_settings)
{
    char start_str[32];
    char end_str[32];
    char cue_str[1024];

    int matches = sscanf(line, " %31s --> %31s%1023[^\n\r]", start_str, end_str, cue_str);
    *start_pts = -1;
    *cue_settings = NULL;

    printf("Matches: %d\n", matches);

    if (matches >= 1) {
        *start_pts = parse_timestamp(start_str);
        printf("Start pts: %f\n", *start_pts);
    }
    if (matches >= 2) {
        *end_pts = parse_timestamp(end_str);
    }
    if ((matches == 3) && (strlen(cue_str) > 0)) {
        int cue_size = strlen(cue_str);
        *cue_settings = malloc(cue_size + 1);
        strncpy(*cue_settings, cue_str, cue_size);
        (*cue_settings)[cue_size] = '\0';
    }
}